

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O2

uint16_t __thiscall Color::to_bgr_word(Color *this)

{
  ushort uVar1;
  
  uVar1 = 0xffff;
  if (this->_invalid == false) {
    uVar1 = (this->_b & 0xf0) << 4 | this->_g & 0xfff0 | (ushort)(this->_r >> 4);
  }
  return uVar1;
}

Assistant:

[[nodiscard]] uint16_t Color::to_bgr_word() const
{
    if(_invalid)
        return 0xFFFF;

    uint16_t color_word = 0;
    color_word |= _r >> 4;
    color_word |= (_g >> 4) << 4;
    color_word |= (_b >> 4) << 8;
    return color_word;
}